

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O3

ssize_t __thiscall jaegertracing::thrift::Log::write(Log *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer pTVar7;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"Log");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"timestamp",10,1);
  iVar3 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->timestamp);
  iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[6])(this_00,"fields",0xf,2);
  iVar6 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xc,
                     (ulong)(uint)((int)((ulong)((long)(this->fields).
                                                                                                              
                                                  super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->fields).
                                                                                                            
                                                  super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                  0x38e38e39));
  iVar1 = iVar5 + iVar6 + iVar3 + iVar4 + iVar2 + iVar1;
  for (pTVar7 = (this->fields).
                super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 != (this->fields).
                super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
                ._M_impl.super__Vector_impl_data._M_finish; pTVar7 = pTVar7 + 1) {
    iVar2 = (**(code **)(*(long *)pTVar7 + 0x18))(pTVar7,this_00);
    iVar1 = iVar1 + iVar2;
  }
  iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar4 + iVar5 + iVar2 + iVar1);
}

Assistant:

uint32_t Log::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("Log");

  xfer += oprot->writeFieldBegin("timestamp", ::apache::thrift::protocol::T_I64, 1);
  xfer += oprot->writeI64(this->timestamp);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("fields", ::apache::thrift::protocol::T_LIST, 2);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->fields.size()));
    std::vector<Tag> ::const_iterator _iter8;
    for (_iter8 = this->fields.begin(); _iter8 != this->fields.end(); ++_iter8)
    {
      xfer += (*_iter8).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}